

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encoder.cpp
# Opt level: O0

void __thiscall
Encoder::CopyMaps<true>
          (Encoder *this,OffsetList **m_origInlineeFrameRecords,OffsetList **m_origInlineeFrameMap,
          OffsetList **m_origPragmaInstrToRecordOffset,OffsetList **m_origOffsetBuffer)

{
  Type TVar1;
  List<InlineeFrameRecord_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_00;
  List<NativeOffsetInlineeFramePair,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_01;
  List<IR::PragmaInstr_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_02;
  List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *this_03;
  List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *this_04;
  List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *this_05;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint32 uVar6;
  undefined4 *puVar7;
  Type *pTVar8;
  Type *ppIVar9;
  Type *pTVar10;
  Type *ppPVar11;
  uint local_70;
  int local_6c;
  uint i_3;
  int i_2;
  int i_1;
  int i;
  OffsetList *origPInstrList;
  OffsetList *origMapList;
  OffsetList *origRecList;
  PragmaInstrList *pInstrList;
  ArenaInlineeFrameMap *mapList;
  InlineeFrameRecords *recList;
  OffsetList **m_origOffsetBuffer_local;
  OffsetList **m_origPragmaInstrToRecordOffset_local;
  OffsetList **m_origInlineeFrameMap_local;
  OffsetList **m_origInlineeFrameRecords_local;
  Encoder *this_local;
  
  this_00 = this->m_inlineeFrameRecords;
  this_01 = this->m_inlineeFrameMap;
  this_02 = this->m_pragmaInstrToRecordOffset;
  if (((*m_origInlineeFrameRecords == (OffsetList *)0x0) ||
      (*m_origInlineeFrameMap == (OffsetList *)0x0)) ||
     (*m_origPragmaInstrToRecordOffset == (OffsetList *)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Encoder.cpp"
                       ,0x610,
                       "((*m_origInlineeFrameRecords) && (*m_origInlineeFrameMap) && (*m_origPragmaInstrToRecordOffset))"
                       ,
                       "(*m_origInlineeFrameRecords) && (*m_origInlineeFrameMap) && (*m_origPragmaInstrToRecordOffset)"
                      );
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  this_03 = *m_origInlineeFrameRecords;
  this_04 = *m_origInlineeFrameMap;
  this_05 = *m_origPragmaInstrToRecordOffset;
  iVar4 = JsUtil::ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>::Count
                    (&this_03->
                      super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>);
  iVar5 = JsUtil::ReadOnlyList<InlineeFrameRecord_*,_Memory::ArenaAllocator,_DefaultComparer>::Count
                    (&this_00->
                      super_ReadOnlyList<InlineeFrameRecord_*,_Memory::ArenaAllocator,_DefaultComparer>
                    );
  if (iVar4 != iVar5) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Encoder.cpp"
                       ,0x614,"(origRecList->Count() == recList->Count())",
                       "origRecList->Count() == recList->Count()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  iVar4 = JsUtil::ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>::Count
                    (&this_04->
                      super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>);
  iVar5 = JsUtil::
          ReadOnlyList<NativeOffsetInlineeFramePair,_Memory::ArenaAllocator,_DefaultComparer>::Count
                    (&this_01->
                      super_ReadOnlyList<NativeOffsetInlineeFramePair,_Memory::ArenaAllocator,_DefaultComparer>
                    );
  if (iVar4 != iVar5) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Encoder.cpp"
                       ,0x615,"(origMapList->Count() == mapList->Count())",
                       "origMapList->Count() == mapList->Count()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  iVar4 = JsUtil::ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>::Count
                    (&this_05->
                      super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>);
  iVar5 = JsUtil::ReadOnlyList<IR::PragmaInstr_*,_Memory::ArenaAllocator,_DefaultComparer>::Count
                    (&this_02->
                      super_ReadOnlyList<IR::PragmaInstr_*,_Memory::ArenaAllocator,_DefaultComparer>
                    );
  if (iVar4 != iVar5) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Encoder.cpp"
                       ,0x616,"(origPInstrList->Count() == pInstrList->Count())",
                       "origPInstrList->Count() == pInstrList->Count()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  if (m_origOffsetBuffer == (OffsetList **)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Encoder.cpp"
                       ,0x619,"(m_origOffsetBuffer)","m_origOffsetBuffer");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  uVar6 = JsUtil::ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>::Count
                    (&(*m_origOffsetBuffer)->
                      super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>);
  if (uVar6 != this->m_instrNumber) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Encoder.cpp"
                       ,0x61a,"((uint32)(*m_origOffsetBuffer)->Count() == m_instrNumber)",
                       "(uint32)(*m_origOffsetBuffer)->Count() == m_instrNumber");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  i_2 = 0;
  while( true ) {
    iVar4 = JsUtil::ReadOnlyList<InlineeFrameRecord_*,_Memory::ArenaAllocator,_DefaultComparer>::
            Count(&this_00->
                   super_ReadOnlyList<InlineeFrameRecord_*,_Memory::ArenaAllocator,_DefaultComparer>
                 );
    if (iVar4 <= i_2) break;
    pTVar8 = JsUtil::
             List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             ::Item(this_03,i_2);
    TVar1 = *pTVar8;
    ppIVar9 = JsUtil::
              List<InlineeFrameRecord_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              ::Item(this_00,i_2);
    (*ppIVar9)->inlineeStartOffset = TVar1;
    i_2 = i_2 + 1;
  }
  i_3 = 0;
  while( true ) {
    iVar4 = JsUtil::
            ReadOnlyList<NativeOffsetInlineeFramePair,_Memory::ArenaAllocator,_DefaultComparer>::
            Count(&this_01->
                   super_ReadOnlyList<NativeOffsetInlineeFramePair,_Memory::ArenaAllocator,_DefaultComparer>
                 );
    if (iVar4 <= (int)i_3) break;
    pTVar8 = JsUtil::
             List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             ::Item(this_04,i_3);
    TVar1 = *pTVar8;
    pTVar10 = JsUtil::
              List<NativeOffsetInlineeFramePair,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              ::Item(this_01,i_3);
    pTVar10->offset = TVar1;
    i_3 = i_3 + 1;
  }
  local_6c = 0;
  while( true ) {
    iVar4 = JsUtil::ReadOnlyList<IR::PragmaInstr_*,_Memory::ArenaAllocator,_DefaultComparer>::Count
                      (&this_02->
                        super_ReadOnlyList<IR::PragmaInstr_*,_Memory::ArenaAllocator,_DefaultComparer>
                      );
    if (iVar4 <= local_6c) break;
    pTVar8 = JsUtil::
             List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             ::Item(this_05,local_6c);
    TVar1 = *pTVar8;
    ppPVar11 = JsUtil::
               List<IR::PragmaInstr_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               ::Item(this_02,local_6c);
    (*ppPVar11)->m_offsetInBuffer = TVar1;
    local_6c = local_6c + 1;
  }
  (*((*m_origInlineeFrameRecords)->
    super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>)._vptr_ReadOnlyList[1]
  )();
  (*((*m_origInlineeFrameMap)->
    super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>)._vptr_ReadOnlyList[1]
  )();
  (*((*m_origPragmaInstrToRecordOffset)->
    super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>)._vptr_ReadOnlyList[1]
  )();
  *m_origInlineeFrameRecords = (OffsetList *)0x0;
  *m_origInlineeFrameMap = (OffsetList *)0x0;
  *m_origPragmaInstrToRecordOffset = (OffsetList *)0x0;
  for (local_70 = 0; local_70 < this->m_instrNumber; local_70 = local_70 + 1) {
    pTVar8 = JsUtil::
             List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             ::Item(*m_origOffsetBuffer,local_70);
    this->m_offsetBuffer[local_70] = *pTVar8;
  }
  (*((*m_origOffsetBuffer)->
    super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>)._vptr_ReadOnlyList[1]
  )();
  *m_origOffsetBuffer = (OffsetList *)0x0;
  return;
}

Assistant:

void Encoder::CopyMaps(OffsetList **m_origInlineeFrameRecords
    , OffsetList **m_origInlineeFrameMap
    , OffsetList **m_origPragmaInstrToRecordOffset
    , OffsetList **m_origOffsetBuffer
    )
{
    InlineeFrameRecords *recList = m_inlineeFrameRecords;
    ArenaInlineeFrameMap *mapList = m_inlineeFrameMap;
    PragmaInstrList *pInstrList = m_pragmaInstrToRecordOffset;

    OffsetList *origRecList, *origMapList, *origPInstrList;
    if (!restore)
    {
        Assert(*m_origInlineeFrameRecords == nullptr);
        Assert(*m_origInlineeFrameMap == nullptr);
        Assert(*m_origPragmaInstrToRecordOffset == nullptr);

        *m_origInlineeFrameRecords = origRecList = Anew(m_tempAlloc, OffsetList, m_tempAlloc);
        *m_origInlineeFrameMap = origMapList = Anew(m_tempAlloc, OffsetList, m_tempAlloc);
        *m_origPragmaInstrToRecordOffset = origPInstrList = Anew(m_tempAlloc, OffsetList, m_tempAlloc);

#if DBG_DUMP
        Assert((*m_origOffsetBuffer) == nullptr);
        *m_origOffsetBuffer = Anew(m_tempAlloc, OffsetList, m_tempAlloc);
#endif
    }
    else
    {
        Assert((*m_origInlineeFrameRecords) && (*m_origInlineeFrameMap) && (*m_origPragmaInstrToRecordOffset));
        origRecList = *m_origInlineeFrameRecords;
        origMapList = *m_origInlineeFrameMap;
        origPInstrList = *m_origPragmaInstrToRecordOffset;
        Assert(origRecList->Count() == recList->Count());
        Assert(origMapList->Count() == mapList->Count());
        Assert(origPInstrList->Count() == pInstrList->Count());

#if DBG_DUMP
        Assert(m_origOffsetBuffer);
        Assert((uint32)(*m_origOffsetBuffer)->Count() == m_instrNumber);
#endif
    }

    for (int i = 0; i < recList->Count(); i++)
    {
        if (!restore)
        {
            origRecList->Add(recList->Item(i)->inlineeStartOffset);
        }
        else
        {
            recList->Item(i)->inlineeStartOffset = origRecList->Item(i);
        }
    }

    for (int i = 0; i < mapList->Count(); i++)
    {
        if (!restore)
        {
            origMapList->Add(mapList->Item(i).offset);
        }
        else
        {
            mapList->Item(i).offset = origMapList->Item(i);
        }
    }

    for (int i = 0; i < pInstrList->Count(); i++)
    {
        if (!restore)
        {
            origPInstrList->Add(pInstrList->Item(i)->m_offsetInBuffer);
        }
        else
        {
            pInstrList->Item(i)->m_offsetInBuffer = origPInstrList->Item(i);
        }
    }

    if (restore)
    {
        (*m_origInlineeFrameRecords)->Delete();
        (*m_origInlineeFrameMap)->Delete();
        (*m_origPragmaInstrToRecordOffset)->Delete();
        (*m_origInlineeFrameRecords) = nullptr;
        (*m_origInlineeFrameMap) = nullptr;
        (*m_origPragmaInstrToRecordOffset) = nullptr;
    }

#if DBG_DUMP
    for (uint i = 0; i < m_instrNumber; i++)
    {
        if (!restore)
        {
            (*m_origOffsetBuffer)->Add(m_offsetBuffer[i]);
        }
        else
        {
            m_offsetBuffer[i] = (*m_origOffsetBuffer)->Item(i);
        }
    }

    if (restore)
    {
        (*m_origOffsetBuffer)->Delete();
        (*m_origOffsetBuffer) = nullptr;
    }
#endif
}